

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_constr.cc
# Opt level: O0

void __thiscall
mp::BasicConstraintKeeper::DoAddAcceptanceOptions
          (BasicConstraintKeeper *this,BasicFlatConverter *param_2,BasicFlatModelAPI *ma,Env *env)

{
  ValueArrayRef values;
  ValueArrayRef values_00;
  ValueArrayRef values_01;
  int iVar1;
  SolverOptionManager *this_00;
  undefined4 extraout_var;
  char *description;
  long in_RCX;
  undefined8 in_RDX;
  BasicConstraintKeeper *in_RDI;
  bool expr_intf_acc;
  bool expracc;
  bool conacc;
  ExpressionAcceptanceLevel eial;
  ExpressionAcceptanceLevel eal;
  ConstraintAcceptanceLevel cal;
  int *in_stack_fffffffffffffeb8;
  string *psVar2;
  char *in_stack_fffffffffffffec0;
  int *in_stack_fffffffffffffec8;
  int *name;
  SolverOptionManager *in_stack_fffffffffffffed0;
  CStringRef in_stack_fffffffffffffed8;
  char *in_stack_fffffffffffffee0;
  char *in_stack_fffffffffffffee8;
  SolverOptionManager *in_stack_fffffffffffffef0;
  ValueArrayRef local_100;
  char *local_f0;
  BasicCStringRef<char> local_e8;
  string local_e0 [32];
  ValueArrayRef local_c0;
  char *local_b0;
  BasicCStringRef<char> local_a8;
  string local_a0 [48];
  ValueArrayRef local_70;
  char *local_60;
  BasicCStringRef<char> local_58;
  string local_50 [33];
  undefined1 local_2f;
  undefined1 local_2e;
  undefined1 local_2d;
  int local_2c;
  int local_28;
  int local_24;
  long local_20;
  undefined8 local_18;
  CStringRef arg0;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_24 = (*in_RDI->_vptr_BasicConstraintKeeper[0x10])(in_RDI,in_RDX);
  local_28 = (*in_RDI->_vptr_BasicConstraintKeeper[0x11])(in_RDI,local_18);
  local_2c = (*in_RDI->_vptr_BasicConstraintKeeper[0x12])(in_RDI,local_18);
  local_2d = local_24 != 0;
  local_2e = local_28 != 0;
  local_2f = local_2c != 0;
  in_RDI->acc_level_item_ = -1;
  in_RDI->acc_level_default_ = 0;
  if ((bool)local_2d) {
    in_RDI->acc_level_default_ = local_24;
  }
  if (((bool)local_2e) && ((bool)local_2f)) {
    in_RDI->acc_level_default_ = local_28 + 2;
  }
  if (((bool)local_2d) && ((bool)local_2e)) {
    this_00 = (SolverOptionManager *)(local_20 + 0x28);
    iVar1 = (*in_RDI->_vptr_BasicConstraintKeeper[0x1b])();
    arg0.data_ = (char *)CONCAT44(extraout_var,iVar1);
    fmt::BasicCStringRef<char>::BasicCStringRef
              (&local_58,
               "Solver acceptance level for \'{}\' as either constraint or expression, default {}:\n\n.. value-table::"
              );
    local_60 = GetConstraintName(in_RDI);
    psVar2 = local_50;
    fmt::format<char_const*,int>(arg0,(char **)this_00,in_stack_fffffffffffffec8);
    std::__cxx11::string::c_str();
    ValueArrayRef::ValueArrayRef<5>
              (&local_70,(OptionValueInfo (*) [5])values_universal_acceptance,0);
    values._8_8_ = psVar2;
    values.values_ = (OptionValueInfo *)arg0.data_;
    SolverOptionManager::AddStoredOption<int>
              (this_00,(char *)in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
               in_stack_fffffffffffffeb8,values);
    std::__cxx11::string::~string(local_50);
  }
  else if ((bool)local_2d) {
    (*in_RDI->_vptr_BasicConstraintKeeper[0x1b])();
    fmt::BasicCStringRef<char>::BasicCStringRef
              (&local_a8,
               "Solver acceptance level for \'{}\' as flat constraint, default {}:\n\n.. value-table::"
              );
    local_b0 = GetConstraintName(in_RDI);
    psVar2 = local_a0;
    fmt::format<char_const*,int>
              (in_stack_fffffffffffffed8,(char **)in_stack_fffffffffffffed0,
               in_stack_fffffffffffffec8);
    description = (char *)std::__cxx11::string::c_str();
    name = &in_RDI->acc_level_item_;
    ValueArrayRef::ValueArrayRef<3>(&local_c0,(OptionValueInfo (*) [3])values_con_acceptance,0);
    values_00._8_8_ = in_stack_fffffffffffffee0;
    values_00.values_ = (OptionValueInfo *)in_stack_fffffffffffffed8.data_;
    SolverOptionManager::AddStoredOption<int>
              (in_stack_fffffffffffffed0,(char *)name,description,(int *)psVar2,values_00);
    std::__cxx11::string::~string(local_a0);
  }
  else if ((bool)local_2e) {
    (*in_RDI->_vptr_BasicConstraintKeeper[0x1b])();
    fmt::BasicCStringRef<char>::BasicCStringRef
              (&local_e8,
               "Solver acceptance level for \'{}\' as expression, default {}:\n\n.. value-table::");
    local_f0 = GetConstraintName(in_RDI);
    fmt::format<char_const*,int>
              (in_stack_fffffffffffffed8,(char **)in_stack_fffffffffffffed0,
               in_stack_fffffffffffffec8);
    std::__cxx11::string::c_str();
    ValueArrayRef::ValueArrayRef<3>(&local_100,(OptionValueInfo (*) [3])values_expr_acceptance,0);
    values_01._8_8_ = in_stack_fffffffffffffee0;
    values_01.values_ = (OptionValueInfo *)in_stack_fffffffffffffed8.data_;
    SolverOptionManager::AddStoredOption<int>
              (in_stack_fffffffffffffed0,(char *)in_stack_fffffffffffffec8,in_stack_fffffffffffffec0
               ,in_stack_fffffffffffffeb8,values_01);
    std::__cxx11::string::~string(local_e0);
  }
  else {
    (*in_RDI->_vptr_BasicConstraintKeeper[0x1b])();
    SolverOptionManager::AddStoredOption<int>
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
               (int *)in_stack_fffffffffffffed8.data_,
               (int)((ulong)in_stack_fffffffffffffed0 >> 0x20),(int)in_stack_fffffffffffffed0);
  }
  return;
}

Assistant:

void BasicConstraintKeeper::DoAddAcceptanceOptions(
    BasicFlatConverter& ,
    const BasicFlatModelAPI& ma,
    Env& env) {
  auto cal = GetModelAPIAcceptance(ma);
  auto eal = GetModelAPIAcceptanceEXPR(ma);
  auto eial = GetModelAPIAcceptance_EXPR_INTF(ma);
  const bool conacc = (ConstraintAcceptanceLevel::NotAccepted != cal);
  const bool expracc = (ExpressionAcceptanceLevel::NotAccepted != eal);
  const bool expr_intf_acc = (ExpressionAcceptanceLevel::NotAccepted != eial);
  acc_level_item_ = -1;           // user: unset
  acc_level_default_ = 0;         // default: not accepted
  if (conacc)
    acc_level_default_
        = std::underlying_type_t<ConstraintAcceptanceLevel>(cal);
  // we prefer expressions, if ModelAPI accepts expression interface
  if (expracc && expr_intf_acc)
    acc_level_default_      // Won't be taken however, if acc:_expr==0
        = std::underlying_type_t<ExpressionAcceptanceLevel>(eal) + 2;
  if (conacc && expracc) {
    env.AddStoredOption(GetAcceptanceOptionNames(),
                        fmt::format(
                            "Solver acceptance level for '{}' as either constraint or expression, "
                            "default {}:\n\n.. value-table::",
                            GetConstraintName(), acc_level_default_).c_str(),
                        acc_level_item_, values_universal_acceptance);
  } else
    if (conacc) {
      env.AddStoredOption(GetAcceptanceOptionNames(),
                          fmt::format(
                              "Solver acceptance level for '{}' as flat constraint, "
                              "default {}:\n\n.. value-table::",
                              GetConstraintName(), acc_level_default_).c_str(),
                          acc_level_item_, values_con_acceptance);
    } else
      if (expracc) {
        env.AddStoredOption(GetAcceptanceOptionNames(),
                            fmt::format(
                                "Solver acceptance level for '{}' as expression, "
                                "default {}:\n\n.. value-table::",
                                GetConstraintName(), acc_level_default_).c_str(),
                            acc_level_item_, values_expr_acceptance);
      } else {
        env.AddStoredOption(GetAcceptanceOptionNames(),
                            "HIDDEN",
                            acc_level_item_, 0, 4);
      }
}